

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-attach-file.cc
# Opt level: O0

void usage(string *msg)

{
  ostream *poVar1;
  string *msg_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)msg);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Usage: ");
  poVar1 = std::operator<<(poVar1,whoami);
  poVar1 = std::operator<<(poVar1," options");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Options:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1," --infile infile.pdf");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1," --outfile outfile.pdf");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1," --attachment attachment");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1," [--password infile-password]");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1," [--mimetype attachment mime type]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  exit(2);
}

Assistant:

static void
usage(std::string const& msg)
{
    std::cerr << msg << std::endl
              << std::endl
              << "Usage: " << whoami << " options" << std::endl
              << "Options:" << std::endl
              << " --infile infile.pdf" << std::endl
              << " --outfile outfile.pdf" << std::endl
              << " --attachment attachment" << std::endl
              << " [--password infile-password]" << std::endl
              << " [--mimetype attachment mime type]" << std::endl;
    exit(2);
}